

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O2

int gost_magma_cipher_do_mgm(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t len)

{
  int iVar1;
  long lVar2;
  uchar *puVar3;
  mgm128_context *ctx_00;
  size_t sStack_30;
  
  lVar2 = EVP_CIPHER_CTX_get_cipher_data();
  iVar1 = EVP_CIPHER_CTX_is_encrypting(ctx);
  if (*(int *)(lVar2 + 0x1088) == 0) {
    iVar1 = 0x38e;
LAB_00116c26:
    ERR_GOST_error(0xa8,0x84,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_crypt.c"
                   ,iVar1);
  }
  else {
    if (*(int *)(lVar2 + 0x108c) == 0) {
      iVar1 = 0x394;
      goto LAB_00116c26;
    }
    if (in == (uchar *)0x0) {
      if (iVar1 == 0) {
        sStack_30 = 0xffffffffffffffff;
        len = sStack_30;
        if (*(int *)(lVar2 + 0x1164) < 0) goto LAB_00116c7e;
        puVar3 = (uchar *)EVP_CIPHER_CTX_buf_noconst(ctx);
        iVar1 = gost_mgm128_finish((mgm128_context *)(lVar2 + 0x1090),puVar3,
                                   (long)*(int *)(lVar2 + 0x1164));
        len = 0xffffffffffffffff;
        if (iVar1 != 0) goto LAB_00116c7e;
      }
      else {
        puVar3 = (uchar *)EVP_CIPHER_CTX_buf_noconst(ctx);
        gost_mgm128_tag((mgm128_context *)(lVar2 + 0x1090),puVar3,8);
        *(undefined4 *)(lVar2 + 0x1164) = 8;
      }
      *(undefined4 *)(lVar2 + 0x108c) = 0;
      len = 0;
      goto LAB_00116c7e;
    }
    ctx_00 = (mgm128_context *)(lVar2 + 0x1090);
    if (out == (uchar *)0x0) {
      iVar1 = gost_mgm128_aad(ctx_00,in,len);
    }
    else if (iVar1 == 0) {
      iVar1 = gost_mgm128_decrypt(ctx_00,in,out,len);
    }
    else {
      iVar1 = gost_mgm128_encrypt(ctx_00,in,out,len);
    }
    if (iVar1 == 0) goto LAB_00116c7e;
  }
  len = 0xffffffffffffffff;
LAB_00116c7e:
  return (int)len;
}

Assistant:

static int gost_magma_cipher_do_mgm(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                   const unsigned char *in, size_t len)
{
    gost_mgm_ctx *mctx =
        (gost_mgm_ctx *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    int enc = EVP_CIPHER_CTX_encrypting(ctx);

    /* If not set up, return error */
    if (!mctx->key_set) {
        GOSTerr(GOST_F_GOST_MAGMA_CIPHER_DO_MGM,
                GOST_R_BAD_ORDER);
        return -1;
    }

    if (!mctx->iv_set) {
        GOSTerr(GOST_F_GOST_MAGMA_CIPHER_DO_MGM,
                GOST_R_BAD_ORDER);
        return -1;
    }
    if (in) {
        if (out == NULL) {
            if (gost_mgm128_aad(&mctx->mgm, in, len))
                return -1;
        } else if (enc) {
            if (gost_mgm128_encrypt(&mctx->mgm, in, out, len))
                return -1;
        } else {
            if (gost_mgm128_decrypt(&mctx->mgm, in, out, len))
                return -1;
        }
        return len;
    } else {
        if (!enc) {
            if (mctx->taglen < 0)
                return -1;
            if (gost_mgm128_finish(&mctx->mgm,
                                   EVP_CIPHER_CTX_buf_noconst(ctx),
                                   mctx->taglen) != 0)
                return -1;
            mctx->iv_set = 0;
            return 0;
        }
        gost_mgm128_tag(&mctx->mgm, EVP_CIPHER_CTX_buf_noconst(ctx), 8);
        mctx->taglen = 8;
        /* Don't reuse the IV */
        mctx->iv_set = 0;
        return 0;
    }

}